

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O1

QueryResult * __thiscall
OnDiskDataset::query
          (QueryResult *__return_storage_ptr__,OnDiskDataset *this,Query *query,
          QueryCounters *counters)

{
  set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_> seen;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Rb_tree<PrimitiveQuery,_PrimitiveQuery,_std::_Identity<PrimitiveQuery>,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
  local_38;
  
  local_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_38._M_impl.super__Rb_tree_header._M_header;
  local_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._8_8_ = &local_38;
  pcStack_40 = std::
               _Function_handler<QueryResult_(PrimitiveQuery,_QueryCounters_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:73:9)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<QueryResult_(PrimitiveQuery,_QueryCounters_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:73:9)>
             ::_M_manager;
  pcStack_60 = std::
               _Function_handler<void_(PrimitiveQuery),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:86:9)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(PrimitiveQuery),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/OnDiskDataset.cpp:86:9)>
             ::_M_manager;
  local_78._M_unused._M_object = this;
  local_58._M_unused._M_object = this;
  local_58._8_8_ = local_78._8_8_;
  local_38._M_impl.super__Rb_tree_header._M_header._M_right =
       local_38._M_impl.super__Rb_tree_header._M_header._M_left;
  Query::run(__return_storage_ptr__,query,(QueryPrimitive *)&local_58,(PrefetchFunc *)&local_78,
             counters);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  std::
  _Rb_tree<PrimitiveQuery,_PrimitiveQuery,_std::_Identity<PrimitiveQuery>,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
  ::~_Rb_tree(&local_38);
  return __return_storage_ptr__;
}

Assistant:

QueryResult OnDiskDataset::query(const Query &query,
                                 QueryCounters *counters) const {
    std::set<PrimitiveQuery> seen;
    return query.run(
        [this, &seen](PrimitiveQuery primitive, QueryCounters *counters) {
            std::optional<QueryOperation> operation;
            if (seen.count(primitive) == 0) {
                operation = std::make_optional(&counters->uniq_reads());
                seen.insert(primitive);
            }
            for (auto &ndx : indices) {
                if (ndx.index_type() == primitive.itype) {
                    return ndx.query(primitive.trigram, counters);
                }
            }
            throw std::runtime_error("Unexpected ngram type in query");
        },
        [this, &seen](PrimitiveQuery primitive) {
            for (auto &ndx : indices) {
                if (ndx.index_type() == primitive.itype) {
                    ndx.prefetch(primitive.trigram);
                }
            }
        },
        counters);
}